

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall ki::dml::Field<int>::from_xml(Field<int> *this,xml_node<char> *node)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  value_error *pvVar4;
  ulong uVar5;
  string local_430 [39];
  allocator local_409;
  string local_408 [8];
  string value;
  string local_3e0 [32];
  ostringstream local_3c0 [8];
  ostringstream oss_1;
  allocator local_241;
  string local_240 [8];
  string value_2;
  string local_218 [32];
  ostringstream local_1f8 [8];
  ostringstream oss;
  allocator local_79;
  string local_78 [8];
  string value_1;
  allocator local_41;
  string local_40 [8];
  string name;
  xml_attribute<char> *local_20;
  xml_attribute<char> *attr;
  xml_node<char> *node_local;
  Field<int> *this_local;
  
  pcVar2 = rapidxml::xml_base<char>::name(&node->super_xml_base<char>);
  std::__cxx11::string::operator=((string *)&(this->super_FieldBase).m_name,pcVar2);
  (this->super_FieldBase).m_transferable = true;
  local_20 = rapidxml::xml_node<char>::first_attribute(node,(char *)0x0,0,true);
  do {
    if (local_20 == (xml_attribute<char> *)0x0) {
      pcVar2 = rapidxml::xml_base<char>::value(&node->super_xml_base<char>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_408,pcVar2,&local_409);
      std::allocator<char>::~allocator((allocator<char> *)&local_409);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::string(local_430,local_408);
        set_value_from_string(this,(string *)local_430);
        std::__cxx11::string::~string(local_430);
      }
      std::__cxx11::string::~string(local_408);
      return;
    }
    pcVar2 = rapidxml::xml_base<char>::name(&local_20->super_xml_base<char>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar2,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"TYPE");
    if (bVar1) {
      pcVar2 = rapidxml::xml_base<char>::value(&local_20->super_xml_base<char>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,pcVar2,&local_79);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      pcVar2 = get_type_name(this);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_78,pcVar2);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_1f8);
        std::operator<<((ostream *)local_1f8,"XML Field node has incorrect TYPE attribute value. ");
        poVar3 = std::operator<<((ostream *)local_1f8,"(value=\"");
        poVar3 = std::operator<<(poVar3,local_78);
        poVar3 = std::operator<<(poVar3,"\", expected=\"");
        pcVar2 = get_type_name(this);
        poVar3 = std::operator<<(poVar3,pcVar2);
        std::operator<<(poVar3,"\". ");
        pvVar4 = (value_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        value_error::value_error(pvVar4,local_218);
        __cxa_throw(pvVar4,&value_error::typeinfo,value_error::~value_error);
      }
      std::__cxx11::string::~string(local_78);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"NOXFER");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_3c0);
        poVar3 = std::operator<<((ostream *)local_3c0,"XML Field node has unknown attribute \"");
        poVar3 = std::operator<<(poVar3,local_40);
        std::operator<<(poVar3,"\".");
        pvVar4 = (value_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        value_error::value_error(pvVar4,local_3e0);
        __cxa_throw(pvVar4,&value_error::typeinfo,value_error::~value_error);
      }
      pcVar2 = rapidxml::xml_base<char>::value(&local_20->super_xml_base<char>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,pcVar2,&local_241);
      std::allocator<char>::~allocator((allocator<char> *)&local_241);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_240,"TRUE");
      (this->super_FieldBase).m_transferable = bVar1;
      std::__cxx11::string::~string(local_240);
    }
    std::__cxx11::string::~string(local_40);
    local_20 = rapidxml::xml_attribute<char>::next_attribute(local_20,(char *)0x0,0,true);
  } while( true );
}

Assistant:

void from_xml(const rapidxml::xml_node<> *node) final
		{
			// Use the name of the node as the field name and,
			// default transferable to TRUE.
			m_name = node->name();
			m_transferable = true;

			for (auto *attr = node->first_attribute();
				attr; attr = attr->next_attribute())
			{
				const std::string name = attr->name();
				if (name == "TYPE")
				{
					const std::string value = attr->value();
					if (value != get_type_name())
					{
						std::ostringstream oss;
						oss << "XML Field node has incorrect TYPE attribute value. ";
						oss << "(value=\"" << value << "\", expected=\"" << get_type_name() << "\". ";
						throw value_error(oss.str());
					}
				}
				else if (name == "NOXFER")
				{
					const std::string value = attr->value();
					m_transferable = value != "TRUE";
				}
				else
				{
					std::ostringstream oss;
					oss << "XML Field node has unknown attribute \"" << name << "\".";
					throw value_error(oss.str());
				}
			}

			const std::string value = node->value();
			if (!value.empty())
				set_value_from_string(value);
		}